

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_sel_d(DisasContext_conflict6 *ctx,fopcode op1,int fd,int ft,int fs)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 c2;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i64 t_01;
  TCGv_i64 pTVar1;
  TCGCond cond;
  TCGv_i64 pTVar2;
  uintptr_t o;
  TCGv_i64 pTVar3;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  c2 = tcg_const_i64_mips64el(tcg_ctx,0);
  t = tcg_temp_new_i64(tcg_ctx);
  t_00 = tcg_temp_new_i64(tcg_ctx);
  t_01 = tcg_temp_new_i64(tcg_ctx);
  gen_load_fpr64(ctx,t,fd);
  gen_load_fpr64(ctx,t_00,ft);
  gen_load_fpr64(ctx,t_01,fs);
  pTVar1 = t_00;
  pTVar2 = t_01;
  pTVar3 = c2;
  if (op1 == OPC_SELNEZ_D) {
    tcg_gen_andi_i64_mips64el(tcg_ctx,t_00,t_00,1);
    cond = TCG_COND_NE;
  }
  else if (op1 == OPC_SELEQZ_D) {
    tcg_gen_andi_i64_mips64el(tcg_ctx,t_00,t_00,1);
    cond = TCG_COND_EQ;
  }
  else {
    if (op1 != OPC_SEL_D) {
      generate_exception_end(ctx,0x14);
      goto LAB_0088293b;
    }
    tcg_gen_andi_i64_mips64el(tcg_ctx,t,t,1);
    cond = TCG_COND_NE;
    pTVar1 = t;
    pTVar2 = t_00;
    pTVar3 = t_01;
  }
  tcg_gen_movcond_i64_mips64el(tcg_ctx,cond,t,pTVar1,c2,pTVar2,pTVar3);
LAB_0088293b:
  gen_store_fpr64(ctx,t,fd);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_01 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_sel_d(DisasContext *ctx, enum fopcode op1, int fd, int ft,
                      int fs)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t1 = tcg_const_i64(tcg_ctx, 0);
    TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);
    gen_load_fpr64(ctx, fp0, fd);
    gen_load_fpr64(ctx, fp1, ft);
    gen_load_fpr64(ctx, fp2, fs);

    switch (op1) {
    case OPC_SEL_D:
        tcg_gen_andi_i64(tcg_ctx, fp0, fp0, 1);
        tcg_gen_movcond_i64(tcg_ctx, TCG_COND_NE, fp0, fp0, t1, fp1, fp2);
        break;
    case OPC_SELEQZ_D:
        tcg_gen_andi_i64(tcg_ctx, fp1, fp1, 1);
        tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, fp0, fp1, t1, fp2, t1);
        break;
    case OPC_SELNEZ_D:
        tcg_gen_andi_i64(tcg_ctx, fp1, fp1, 1);
        tcg_gen_movcond_i64(tcg_ctx, TCG_COND_NE, fp0, fp1, t1, fp2, t1);
        break;
    default:
        MIPS_INVAL("gen_sel_d");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }

    gen_store_fpr64(ctx, fp0, fd);
    tcg_temp_free_i64(tcg_ctx, fp2);
    tcg_temp_free_i64(tcg_ctx, fp1);
    tcg_temp_free_i64(tcg_ctx, fp0);
    tcg_temp_free_i64(tcg_ctx, t1);
}